

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

AMQP_MESSENGER_DISPOSITION_RESULT
on_amqp_message_received_callback
          (MESSAGE_HANDLE message,AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info,
          void *context)

{
  bool bVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  LOGGER_LOG p_Var4;
  LIST_ITEM_HANDLE item_handle;
  undefined4 *__ptr;
  code *pcVar5;
  _Bool *p_Var6;
  undefined8 uVar7;
  AMQP_MESSENGER_DISPOSITION_RESULT AVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  _Bool has_status_code;
  _Bool has_version;
  char *correlation_id;
  int status_code;
  AMQP_VALUE amqp_map_value;
  BINARY_DATA twin_report;
  AMQP_VALUE amqp_value;
  int local_48;
  uint32_t pair_count;
  MESSAGE_BODY_TYPE body_type;
  undefined4 uStack_3c;
  int64_t version;
  
  if (message == (MESSAGE_HANDLE)0x0 || context == (void *)0x0) {
    p_Var4 = xlogging_get_log_function();
    AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    pcVar11 = "Invalid argument (message=%p, context=%p)";
    iVar2 = 0x544;
    goto LAB_00139412;
  }
  amqp_messenger_destroy_disposition_info(disposition_info);
  iVar2 = message_get_properties(message,(PROPERTIES_HANDLE *)&twin_report);
  if (iVar2 == 0) {
    if (twin_report.bytes == (uchar *)0x0) {
      correlation_id = (char *)0x0;
    }
    else {
      iVar2 = properties_get_correlation_id((PROPERTIES_HANDLE)twin_report.bytes,&amqp_value);
      if (amqp_value != (AMQP_VALUE)0x0 && iVar2 == 0) {
        iVar2 = amqpvalue_get_string(amqp_value,(char **)&amqp_map_value);
        if (iVar2 == 0) {
          iVar2 = mallocAndStrcpy_s(&correlation_id,(char *)amqp_map_value);
          if (iVar2 == 0) goto LAB_00138f1d;
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed cloning correlation-id";
            iVar2 = 0xfa;
            goto LAB_0013906b;
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed retrieving string from AMQP value";
            iVar2 = 0xf5;
LAB_0013906b:
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"get_message_correlation_id",iVar2,1,pcVar11);
          }
        }
        properties_destroy((PROPERTIES_HANDLE)twin_report.bytes);
        goto LAB_00139080;
      }
      correlation_id = (char *)0x0;
LAB_00138f1d:
      properties_destroy((PROPERTIES_HANDLE)twin_report.bytes);
    }
    iVar2 = message_get_message_annotations(message,&amqp_value);
    if (iVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_001393be;
      pcVar11 = "Failed getting TWIN message annotations";
      iVar2 = 0x1fa;
LAB_00138f74:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"parse_incoming_twin_message",iVar2,1,pcVar11);
LAB_001393be:
      free(correlation_id);
      correlation_id = (char *)0x0;
      goto LAB_001393d1;
    }
    if (amqp_value != (AMQP_VALUE)0x0) {
      iVar2 = amqpvalue_get_map_pair_count(amqp_value,&pair_count);
      if (iVar2 == 0) {
        has_status_code = false;
        has_version = false;
        if (pair_count == 0) {
          amqpvalue_destroy(amqp_value);
        }
        else {
          local_48 = 0;
          uVar13 = 0;
          do {
            iVar2 = amqpvalue_get_map_key_value_pair
                              (amqp_value,(uint32_t)uVar13,(AMQP_VALUE *)&twin_report,
                               &amqp_map_value);
            if (iVar2 == 0) {
              iVar2 = amqpvalue_get_symbol((AMQP_VALUE)twin_report.bytes,(char **)&body_type);
              if (iVar2 != 0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013901c;
                pcVar11 = "Failed getting AMQP value symbol";
                iVar2 = 0x225;
                goto LAB_00139011;
              }
              pcVar11 = (char *)CONCAT44(uStack_3c,body_type);
              iVar2 = strcmp("status",pcVar11);
              if (iVar2 == 0) {
                AVar3 = amqpvalue_get_type(amqp_map_value);
                if (AVar3 != AMQP_TYPE_INT) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013901c;
                  pcVar11 = "TWIN message status property expected to be INT";
                  iVar2 = 0x22f;
                  goto LAB_00139011;
                }
                iVar2 = amqpvalue_get_int(amqp_map_value,&status_code);
                p_Var6 = &has_status_code;
                if (iVar2 != 0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013901c;
                  pcVar11 = "Failed getting TWIN message status code value";
                  iVar2 = 0x235;
                  goto LAB_00139011;
                }
LAB_00139248:
                *p_Var6 = true;
              }
              else {
                iVar2 = strcmp("version",pcVar11);
                if (iVar2 == 0) {
                  AVar3 = amqpvalue_get_type(amqp_map_value);
                  if (AVar3 == AMQP_TYPE_LONG) {
                    iVar2 = amqpvalue_get_long(amqp_map_value,&version);
                    p_Var6 = &has_version;
                    if (iVar2 == 0) goto LAB_00139248;
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013901c;
                    pcVar11 = "Failed getting TWIN message version value";
                    iVar2 = 0x248;
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013901c;
                    pcVar11 = "TWIN message version property expected to be LONG";
                    iVar2 = 0x242;
                  }
                  goto LAB_00139011;
                }
              }
              amqpvalue_destroy(amqp_map_value);
              amqpvalue_destroy((AMQP_VALUE)twin_report.bytes);
            }
            else {
              p_Var4 = xlogging_get_log_function();
              local_48 = 0x21d;
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"parse_incoming_twin_message",0x21c,1,
                          "Failed getting AMQP map key/value pair (%d)",uVar13);
              }
            }
            uVar12 = (uint32_t)uVar13 + 1;
            uVar13 = (ulong)uVar12;
          } while (uVar12 < pair_count);
          amqpvalue_destroy(amqp_value);
          if (local_48 != 0) goto LAB_001393be;
        }
        goto LAB_001390c7;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar11 = "Failed getting TWIN message annotations count";
        iVar2 = 0x20b;
LAB_00139011:
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"parse_incoming_twin_message",iVar2,1,pcVar11);
      }
LAB_0013901c:
      amqpvalue_destroy(amqp_value);
      goto LAB_001393be;
    }
    has_version = false;
    has_status_code = false;
LAB_001390c7:
    iVar2 = message_get_body_type(message,&body_type);
    if (iVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar11 = "Failed getting TWIN message body type";
        iVar2 = 0x263;
        goto LAB_00138f74;
      }
      goto LAB_001393be;
    }
    if (body_type != MESSAGE_BODY_TYPE_NONE) {
      if (body_type == MESSAGE_BODY_TYPE_DATA) {
        iVar2 = message_get_body_amqp_data_count(message,(size_t *)&amqp_map_value);
        if (iVar2 == 0) {
          if (amqp_map_value == (AMQP_VALUE)0x1) {
            iVar2 = message_get_body_amqp_data_in_place(message,0,&twin_report);
            if (iVar2 == 0) {
              bVar1 = true;
              if (correlation_id == (char *)0x0) {
                if (*(code **)((long)context + 0x60) != (code *)0x0) {
                  (**(code **)((long)context + 0x60))
                            (0,twin_report.bytes,twin_report.length,
                             *(undefined8 *)((long)context + 0x68));
                  return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
                }
                return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
              }
              goto LAB_00139300;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar11 = "Failed getting TWIN message body";
              iVar2 = 0x276;
              goto LAB_00138f74;
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar11 = "Unexpected number of TWIN message bodies (%lu)";
              iVar2 = 0x271;
              goto LAB_001393b7;
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar11 = "Failed getting TWIN message body count";
            iVar2 = 0x26c;
            goto LAB_00138f74;
          }
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          amqp_map_value = (AMQP_VALUE)(ulong)body_type;
          pcVar11 = "Unexpected TWIN message body %d";
          iVar2 = 0x280;
LAB_001393b7:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"parse_incoming_twin_message",iVar2,1,pcVar11,amqp_map_value);
        }
      }
      goto LAB_001393be;
    }
    if (correlation_id != (char *)0x0) {
      bVar1 = false;
LAB_00139300:
      item_handle = singlylinkedlist_find
                              (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38),
                               find_twin_operation_by_correlation_id,correlation_id);
      if (item_handle == (LIST_ITEM_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        }
        else {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x566,1,
                    "Could not find context of TWIN incoming message (%s, %s)",
                    *(undefined8 *)((long)context + 0x10),correlation_id);
        }
        goto LAB_00139a9f;
      }
      __ptr = (undefined4 *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr == (undefined4 *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        }
        else {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x56e,1,
                    "Could not get context for incoming TWIN message (%s, %s)",
                    *(undefined8 *)((long)context + 0x10),correlation_id);
        }
      }
      else {
        AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        switch(*__ptr) {
        case 1:
          if (has_status_code == false) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x576,1,
                        "Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)"
                        ,*(undefined8 *)((long)context + 0x10),correlation_id);
            }
            pcVar5 = *(code **)(__ptr + 6);
            AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
            if (pcVar5 != (code *)0x0) {
              uVar7 = *(undefined8 *)(__ptr + 8);
              uVar10 = 1;
              uVar9 = 4;
              status_code = 0;
              goto LAB_00139901;
            }
          }
          else {
            pcVar5 = *(code **)(__ptr + 6);
            if (pcVar5 != (code *)0x0) {
              uVar7 = *(undefined8 *)(__ptr + 8);
              uVar10 = 0;
              uVar9 = 0;
LAB_00139901:
              (*pcVar5)(uVar10,uVar9,status_code,uVar7);
            }
          }
          break;
        case 2:
          if (bVar1) {
            pcVar5 = *(code **)(*(long *)(__ptr + 2) + 0x60);
            if (pcVar5 != (code *)0x0) {
              (*pcVar5)(1,twin_report.bytes,twin_report.length,
                        *(undefined8 *)(*(long *)(__ptr + 2) + 0x68));
            }
            if (*(int *)((long)context + 0x50) == 3) {
              *(undefined4 *)((long)context + 0x50) = 4;
              *(undefined8 *)((long)context + 0x58) = 0;
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x58b,1,
                        "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                        ,*(undefined8 *)((long)context + 0x10),correlation_id);
            }
            pcVar5 = *(code **)(*(long *)(__ptr + 2) + 0x60);
            if (pcVar5 != (code *)0x0) {
              (*pcVar5)(1,0,0,*(undefined8 *)(*(long *)(__ptr + 2) + 0x68));
            }
            AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
            if (*(int *)((long)context + 0x50) == 3) {
              *(undefined4 *)((long)context + 0x50) = 2;
LAB_00139a18:
              *(long *)((long)context + 0x58) = *(long *)((long)context + 0x58) + 1;
            }
          }
          break;
        case 3:
          if (bVar1) {
            (**(code **)(__ptr + 6))
                      (1,twin_report.bytes,twin_report.length,*(undefined8 *)(__ptr + 8));
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x5ac,1,
                        "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                        ,*(undefined8 *)((long)context + 0x10),correlation_id);
            }
            (**(code **)(__ptr + 6))(1,0,0,*(undefined8 *)(__ptr + 8));
            AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
          }
          break;
        case 4:
          if (*(int *)((long)context + 0x50) == 6) {
            if (has_status_code == false) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5bf,1,
                          "Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)"
                          ,*(undefined8 *)((long)context + 0x10),correlation_id);
              }
            }
            else {
              if (0xffffff9b < status_code - 300U) break;
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5c5,1,
                          "Received status code %d for TWIN subscription request (%s, %s)",
                          (ulong)(uint)status_code,*(undefined8 *)((long)context + 0x10),
                          correlation_id);
              }
            }
            if (*(int *)((long)context + 0x50) == 5) {
              *(undefined4 *)((long)context + 0x50) = 4;
              goto LAB_00139a18;
            }
          }
          break;
        case 5:
          if (*(int *)((long)context + 0x50) == 1) {
            if (has_status_code == false) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5e1,1,
                          "Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)"
                          ,*(undefined8 *)((long)context + 0x10),correlation_id);
              }
            }
            else {
              if (0xffffff9b < status_code - 300U) break;
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5e7,1,
                          "Received status code %d for TWIN unsubscription request (%s, %s)",
                          (ulong)(uint)status_code,*(undefined8 *)((long)context + 0x10),
                          correlation_id);
              }
            }
            if (*(int *)((long)context + 0x50) == 8) {
              *(undefined4 *)((long)context + 0x50) = 7;
              goto LAB_00139a18;
            }
          }
        }
        free(*(void **)(__ptr + 4));
        free(__ptr);
      }
      iVar2 = singlylinkedlist_remove
                        (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38),item_handle);
      if (iVar2 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x602,1,
                    "Failed removing context for incoming TWIN message (%s, %s)",
                    *(undefined8 *)((long)context + 0x10),correlation_id);
        }
        iVar2 = *(int *)((long)context + 0x28);
        if (iVar2 != 4) {
          *(undefined4 *)((long)context + 0x28) = 4;
          if (*(code **)((long)context + 0x40) != (code *)0x0) {
            (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48),iVar2,4);
          }
        }
      }
LAB_00139a9f:
      free(correlation_id);
      return AVar8;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    pcVar11 = "Received TWIN message with no correlation-id and no report (%s)";
    iVar2 = 0x615;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"get_message_correlation_id",0xe0,1,"Failed getting AMQP message properties");
    }
LAB_00139080:
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"parse_incoming_twin_message",0x1f1,1,
                "Failed retrieving correlation ID from received TWIN message.");
    }
LAB_001393d1:
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    pcVar11 = "Failed parsing incoming TWIN message (%s)";
    iVar2 = 0x55b;
  }
  AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
  message = *(MESSAGE_HANDLE *)((long)context + 0x10);
LAB_00139412:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,"on_amqp_message_received_callback",iVar2,1,pcVar11,message);
  return AVar8;
}

Assistant:

static AMQP_MESSENGER_DISPOSITION_RESULT on_amqp_message_received_callback(MESSAGE_HANDLE message, AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO* disposition_info, void* context)
{

    AMQP_MESSENGER_DISPOSITION_RESULT disposition_result;

    if (message == NULL || context == NULL)
    {
        LogError("Invalid argument (message=%p, context=%p)", message, context);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)context;

        char* correlation_id;

        bool has_status_code;
        int status_code;

        bool has_version;
        int64_t version;

        bool has_twin_report;
        BINARY_DATA twin_report;

        amqp_messenger_destroy_disposition_info(disposition_info);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;

        if (parse_incoming_twin_message(message, &correlation_id, &has_version, &version, &has_status_code, &status_code, &has_twin_report, &twin_report) != 0)
        {
            LogError("Failed parsing incoming TWIN message (%s)", twin_msgr->device_id);
        }
        else
        {
            if (correlation_id != NULL)
            {
                // It is supposed to be a request sent previously (reported properties PATCH, GET, PUT or DELETE).

                LIST_ITEM_HANDLE list_item;
                if ((list_item = singlylinkedlist_find(twin_msgr->operations, find_twin_operation_by_correlation_id, (const void*)correlation_id)) == NULL)
                {
                    LogError("Could not find context of TWIN incoming message (%s, %s)", twin_msgr->device_id, correlation_id);
                }
                else
                {
                    TWIN_OPERATION_CONTEXT* twin_op_ctx;

                    if ((twin_op_ctx = (TWIN_OPERATION_CONTEXT*)singlylinkedlist_item_get_value(list_item)) == NULL)
                    {
                        LogError("Could not get context for incoming TWIN message (%s, %s)", twin_msgr->device_id, correlation_id);
                    }
                    else
                    {
                        if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
                        {
                            if (!has_status_code)
                            {
                                LogError("Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_ERROR, TWIN_REPORT_STATE_REASON_INVALID_RESPONSE, 0, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_SUCCESS, TWIN_REPORT_STATE_REASON_NONE, status_code, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                                    twin_msgr->subscription_error_count++;
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                    twin_msgr->subscription_error_count = 0;
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->cb.get_twin.context);
                            }
                            else
                            {
                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->cb.get_twin.context);
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBED)
                            {
                                bool subscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN subscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBING)
                                {
                                    if (subscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_DELETE)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED)
                            {
                                bool unsubscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN unsubscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING)
                                {
                                    if (unsubscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }

                        destroy_twin_operation_context(twin_op_ctx);
                    }

                    if (singlylinkedlist_remove(twin_msgr->operations, list_item) != 0)
                    {
                        LogError("Failed removing context for incoming TWIN message (%s, %s)",
                            twin_msgr->device_id, correlation_id);

                        update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
                    }
                }

                free(correlation_id);
            }
            else if (has_twin_report)
            {
                // It is supposed to be a desired properties delta update.

                if (twin_msgr->on_message_received_callback != NULL)
                {
                    twin_msgr->on_message_received_callback(TWIN_UPDATE_TYPE_PARTIAL, (const char*)twin_report.bytes, twin_report.length, twin_msgr->on_message_received_context);
                }
            }
            else
            {
                LogError("Received TWIN message with no correlation-id and no report (%s)", twin_msgr->device_id);
            }
        }
    }

    return disposition_result;
}